

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

string * __thiscall
soul::AST::Connection::getEndpointName_abi_cxx11_
          (string *__return_storage_ptr__,Connection *this,Expression *e,bool isSource)

{
  EndpointDeclaration *pEVar1;
  string *psVar2;
  ConnectionEndpointRef *pCVar3;
  UnqualifiedName *this_00;
  ArrayElementRef *pAVar4;
  Connection *this_01;
  DotOperator *pDVar5;
  ProcessorBase *errorContext;
  undefined1 in_R8B;
  Context *this_02;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  pool_ptr<soul::AST::ProcessorBase> local_60;
  CompileMessage local_58;
  
  (*(this->super_ASTObject)._vptr_ASTObject[8])(&local_60);
  if (local_60.object != (ProcessorBase *)0x0) {
    pEVar1 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                       ((pool_ptr<soul::AST::EndpointDeclaration> *)&local_60);
    psVar2 = Identifier::operator_cast_to_string_(&pEVar1->name);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    return __return_storage_ptr__;
  }
  cast<soul::AST::ConnectionEndpointRef,soul::AST::Expression>((soul *)&local_60,(Expression *)this)
  ;
  if (local_60.object == (ProcessorBase *)0x0) {
    cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_60,(Expression *)this);
    if (local_60.object != (ProcessorBase *)0x0) {
      pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                         ((pool_ptr<soul::AST::ArrayElementRef> *)&local_60);
      this_01 = (Connection *)pool_ptr<soul::AST::Expression>::operator*(&pAVar4->object);
      getEndpointName_abi_cxx11_
                (__return_storage_ptr__,this_01,(Expression *)((ulong)e & 0xff),isSource);
      return __return_storage_ptr__;
    }
    cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_60,(Expression *)this);
    if (local_60.object == (ProcessorBase *)0x0) {
      (*(this->super_ASTObject)._vptr_ASTObject[6])(&local_60,this);
      this_02 = &(this->super_ASTObject).context;
      if (local_60.object != (ProcessorBase *)0x0) {
        errorContext = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_60);
        getDefaultEndpointName_abi_cxx11_
                  (__return_storage_ptr__,(Connection *)this_02,(Context *)errorContext,
                   (ProcessorBase *)(ulong)(byte)((byte)e ^ 1),(bool)in_R8B);
        return __return_storage_ptr__;
      }
      Errors::expectedProcessorOrEndpoint<>();
      Context::throwError(this_02,&local_58,false);
    }
    pDVar5 = pool_ptr<soul::AST::DotOperator>::operator->
                       ((pool_ptr<soul::AST::DotOperator> *)&local_60);
    this_00 = pDVar5->rhs;
  }
  else {
    pCVar3 = pool_ptr<soul::AST::ConnectionEndpointRef>::operator->
                       ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&local_60);
    this_00 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pCVar3->endpointName);
  }
  UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

static std::string getEndpointName (Expression& e, bool isSource)
        {
            if (auto endpoint = e.getAsEndpoint())           return endpoint->name;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->endpointName->toString();
            if (auto ar = cast<ArrayElementRef> (e))         return getEndpointName (*ar->object, isSource);
            if (auto dot = cast<DotOperator> (e))            return dot->rhs.toString();
            if (auto p = e.getAsProcessor())                 return getDefaultEndpointName (e.context, *p, ! isSource);

            e.context.throwError (Errors::expectedProcessorOrEndpoint());
        }